

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_witness_p2wpkh_from_der
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,
              wally_tx_witness_stack **witness)

{
  int iVar1;
  size_t written;
  uchar scriptsig [140];
  size_t local_a0;
  uchar local_98 [144];
  
  iVar1 = wally_scriptsig_p2pkh_from_der(pub_key,pub_key_len,sig,sig_len,local_98,0x8c,&local_a0);
  if (iVar1 == 0) {
    iVar1 = scriptsig_to_witness(local_98,local_a0,witness);
  }
  return iVar1;
}

Assistant:

int wally_witness_p2wpkh_from_der(
    const unsigned char *pub_key,
    size_t pub_key_len,
    const unsigned char *sig,
    size_t sig_len,
    struct wally_tx_witness_stack **witness)
{
    unsigned char scriptsig[WALLY_SCRIPTSIG_P2PKH_MAX_LEN];
    size_t written;
    int ret;

    ret = wally_scriptsig_p2pkh_from_der(pub_key, pub_key_len, sig, sig_len, scriptsig, sizeof(scriptsig), &written);

    if (ret == WALLY_OK)
        ret = scriptsig_to_witness(scriptsig, written, witness);

    return ret;
}